

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMatterMeshless::RemoveCollisionModelsFromSystem(ChMatterMeshless *this)

{
  uint uVar1;
  __shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((this->super_ChIndexedNodes).super_ChPhysicsItem.system != (ChSystem *)0x0) {
    for (uVar1 = 0;
        (ulong)uVar1 <
        (ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4); uVar1 = uVar1 + 1) {
      std::__shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_38,
                   &(((this->super_ChIndexedNodes).super_ChPhysicsItem.system)->collision_system).
                    super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                  );
      (*(local_38._M_ptr)->_vptr_ChCollisionSystem[5])
                (local_38._M_ptr,
                 ((this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar1].
                  super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->collision_model);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    }
    return;
  }
  __assert_fail("GetSystem()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                ,0x2b7,
                "virtual void chrono::fea::ChMatterMeshless::RemoveCollisionModelsFromSystem()");
}

Assistant:

void ChMatterMeshless::RemoveCollisionModelsFromSystem() {
    assert(GetSystem());
    for (unsigned int j = 0; j < nodes.size(); j++) {
        GetSystem()->GetCollisionSystem()->Remove(nodes[j]->collision_model);
    }
}